

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchingWorksWithExtensions_Test::TestBody
          (MatchingTest_MatchingWorksWithExtensions_Test *this)

{
  Descriptor *pDVar1;
  FieldDescriptor *this_00;
  FieldDescriptor *key;
  MutableType pTVar2;
  char *message;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  string_view name;
  string_view name_00;
  AssertHelper AStack_258;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  TestAllExtensions msg2;
  TestAllExtensions msg1;
  MessageDifferencer differencer;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&msg1);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&msg2);
  pDVar1 = proto2_unittest::TestAllExtensions::GetDescriptor();
  name._M_str = "repeated_nested_message_extension";
  name._M_len = 0x21;
  this_00 = FileDescriptor::FindExtensionByName(pDVar1->file_,name);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = this_00 != (FieldDescriptor *)0x0;
  if (this_00 == (FieldDescriptor *)0x0) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&differencer,(internal *)&gtest_ar_,(AssertionResult *)"desc == nullptr",
               "true","false",(char *)CONCAT71(in_register_00000089,in_R9B));
    testing::internal::AssertHelper::AssertHelper
              (&AStack_258,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1085,(char *)differencer.reporter_);
    testing::internal::AssertHelper::operator=(&AStack_258,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_258);
    std::__cxx11::string::~string((string *)&differencer);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pDVar1 = FieldDescriptor::message_type(this_00);
    name_00._M_str = "bb";
    name_00._M_len = 2;
    key = Descriptor::FindFieldByName(pDVar1,name_00);
    util::MessageDifferencer::MessageDifferencer(&differencer);
    util::MessageDifferencer::TreatAsMap(&differencer,this_00,key);
    pTVar2 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       (&msg1,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_nested_message_extension);
    (pTVar2->field_0)._impl_.bb_ = 7;
    *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
    pTVar2 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       (&msg1,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_nested_message_extension);
    (pTVar2->field_0)._impl_.bb_ = 0xd;
    *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
    pTVar2 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       (&msg1,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_nested_message_extension);
    (pTVar2->field_0)._impl_.bb_ = 0xb;
    *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
    pTVar2 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       (&msg2,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_nested_message_extension);
    (pTVar2->field_0)._impl_.bb_ = 0xb;
    *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
    pTVar2 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       (&msg2,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_nested_message_extension);
    (pTVar2->field_0)._impl_.bb_ = 0xd;
    *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
    pTVar2 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       (&msg2,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_nested_message_extension);
    (pTVar2->field_0)._impl_.bb_ = 7;
    *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
    protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
              ((string *)&gtest_ar_,&differencer,(MessageDifferencer *)&msg1,&msg2.super_Message,
               (Message *)0x1,(bool)in_R9B);
    testing::internal::CmpHelperEQ<char[680],std::__cxx11::string>
              ((internal *)&gtest_ar,
               "\"matched: (proto2_unittest.repeated_nested_message_extension)[0].bb ->\" \" (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\\n\" \"moved: (proto2_unittest.repeated_nested_message_extension)[0] ->\" \" (proto2_unittest.repeated_nested_message_extension)[2] :\" \" { bb: 7 }\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[1].bb :\" \" 13\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[1] :\" \" { bb: 13 }\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[2].bb ->\" \" (proto2_unittest.repeated_nested_message_extension)[0].bb :\" \" 11\\n\" \"moved: (proto2_unittest.repeated_nested_message_extension)[2] ->\" \" (proto2_unittest.repeated_nested_message_extension)[0] :\" \" { bb: 11 }\\n\""
               ,"RunWithResult(&differencer, msg1, msg2, true)",
               (char (*) [680])
               "matched: (proto2_unittest.repeated_nested_message_extension)[0].bb -> (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\nmoved: (proto2_unittest.repeated_nested_message_extension)[0] -> (proto2_unittest.repeated_nested_message_extension)[2] : { bb: 7 }\nmatched: (proto2_unittest.repeated_nested_message_extension)[1].bb : 13\nmatched: (proto2_unittest.repeated_nested_message_extension)[1] : { bb: 13 }\nmatched: (proto2_unittest.repeated_nested_message_extension)[2].bb -> (proto2_unittest.repeated_nested_message_extension)[0].bb : 11\nmoved: (proto2_unittest.repeated_nested_message_extension)[2] -> (proto2_unittest.repeated_nested_message_extension)[0] : { bb: 11 }\n"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = anon_var_dwarf_651463 + 5;
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x10a8,message);
      testing::internal::AssertHelper::operator=(&AStack_258,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&AStack_258);
      if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    util::MessageDifferencer::~MessageDifferencer(&differencer);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&msg2);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&msg1);
  return;
}

Assistant:

TEST_F(MatchingTest, MatchingWorksWithExtensions) {
  proto2_unittest::TestAllExtensions msg1, msg2;
  proto2_unittest::TestAllTypes::NestedMessage* nested;
  using proto2_unittest::repeated_nested_message_extension;

  const FileDescriptor* descriptor;
  const FieldDescriptor* desc;
  const FieldDescriptor* nested_key;
  descriptor = msg1.GetDescriptor()->file();
  desc = descriptor->FindExtensionByName("repeated_nested_message_extension");
  ASSERT_FALSE(desc == nullptr);
  nested_key = desc->message_type()->FindFieldByName("bb");

  MessageDifferencer differencer;
  differencer.TreatAsMap(desc, nested_key);

  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(7);
  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(13);
  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(11);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(11);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(13);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(7);

  EXPECT_EQ(
      "matched: (proto2_unittest.repeated_nested_message_extension)[0].bb ->"
      " (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\n"
      "moved: (proto2_unittest.repeated_nested_message_extension)[0] ->"
      " (proto2_unittest.repeated_nested_message_extension)[2] :"
      " { bb: 7 }\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[1].bb :"
      " 13\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[1] :"
      " { bb: 13 }\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[2].bb ->"
      " (proto2_unittest.repeated_nested_message_extension)[0].bb :"
      " 11\n"
      "moved: (proto2_unittest.repeated_nested_message_extension)[2] ->"
      " (proto2_unittest.repeated_nested_message_extension)[0] :"
      " { bb: 11 }\n",
      RunWithResult(&differencer, msg1, msg2, true));
}